

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,libssh2_curve_type curve_type,string_buf *decrypted,
              uchar **method,size_t *method_len,uchar **pubkeydata,size_t *pubkeydata_len,
              EVP_PKEY **ec_ctx)

{
  char *__src;
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  EVP_PKEY *pk;
  undefined1 local_1b0 [40];
  undefined1 local_188 [40];
  undefined1 local_160 [40];
  void *local_138;
  char *group_name;
  char *n;
  OSSL_PARAM params [4];
  EVP_PKEY_CTX *fromdata_ctx;
  EVP_PKEY *ec_key;
  uchar *point_buf;
  uchar *exponent;
  uchar *curve;
  size_t pointlen;
  size_t exponentlen;
  size_t curvelen;
  uchar **ppuStack_40;
  int rc;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *pLStack_18;
  libssh2_curve_type curve_type_local;
  LIBSSH2_SESSION *session_local;
  
  curvelen._4_4_ = 0;
  fromdata_ctx = (EVP_PKEY_CTX *)0x0;
  params[3].return_size = 0;
  ppuStack_40 = pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local._4_4_ = curve_type;
  pLStack_18 = session;
  group_name = (char *)EC_curve_nid2nist(curve_type);
  local_138 = (void *)0x0;
  iVar1 = _libssh2_get_string((string_buf *)method_local,&exponent,&exponentlen);
  if ((iVar1 == 0) && (exponentlen != 0)) {
    iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&ec_key,(size_t *)&curve);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes((string_buf *)method_local,&point_buf,&pointlen);
      if (iVar1 == 0) {
        if (group_name == (char *)0x0) {
          session_local._4_4_ = -1;
        }
        else {
          params[3].return_size = (size_t)EVP_PKEY_CTX_new_id(0x198,(ENGINE *)0x0);
          if ((EVP_PKEY_CTX *)params[3].return_size != (EVP_PKEY_CTX *)0x0) {
            sVar2 = strlen(group_name);
            pvVar3 = (void *)CRYPTO_zalloc(sVar2 + 1,
                                           "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/openssl.c"
                                           ,0xe3b);
            __src = group_name;
            local_138 = pvVar3;
            if (pvVar3 != (void *)0x0) {
              sVar2 = strlen(group_name);
              memcpy(pvVar3,__src,sVar2);
              _libssh2_swap_bytes(point_buf,pointlen);
              OSSL_PARAM_construct_utf8_string(local_160,"group",local_138,0);
              memcpy(&n,local_160,0x28);
              OSSL_PARAM_construct_octet_string(local_188,"pub",ec_key,curve);
              memcpy(&params[0].return_size,local_188,0x28);
              OSSL_PARAM_construct_BN(local_1b0,"priv",point_buf,pointlen);
              memcpy(&params[1].return_size,local_1b0,0x28);
              OSSL_PARAM_construct_end(&pk);
              memcpy(&params[2].return_size,&pk,0x28);
              iVar1 = EVP_PKEY_fromdata_init(params[3].return_size);
              if (0 < iVar1) {
                iVar1 = EVP_PKEY_fromdata(params[3].return_size,&fromdata_ctx,0x87,&n);
                pvVar3 = local_138;
                curvelen._4_4_ = (uint)(iVar1 != 1);
                if (local_138 != (void *)0x0) {
                  sVar2 = strlen(group_name);
                  CRYPTO_clear_free(pvVar3,sVar2,
                                    "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/openssl.c"
                                    ,0xe55);
                }
                if ((((curvelen._4_4_ == 0) && (fromdata_ctx != (EVP_PKEY_CTX *)0x0)) &&
                    (ppuStack_40 != (uchar **)0x0)) && (method_len_local != (size_t *)0x0)) {
                  curvelen._4_4_ =
                       gen_publickey_from_ec_evp
                                 (pLStack_18,(uchar **)method_len_local,(size_t *)pubkeydata_local,
                                  ppuStack_40,pubkeydata_len,0,(EVP_PKEY *)fromdata_ctx);
                }
                if (params[3].return_size != 0) {
                  EVP_PKEY_CTX_free((EVP_PKEY_CTX *)params[3].return_size);
                }
                if (ec_ctx == (EVP_PKEY **)0x0) {
                  EVP_PKEY_free((EVP_PKEY *)fromdata_ctx);
                }
                else {
                  *ec_ctx = (EVP_PKEY *)fromdata_ctx;
                }
                return curvelen._4_4_;
              }
            }
          }
          if (params[3].return_size != 0) {
            EVP_PKEY_CTX_free((EVP_PKEY_CTX *)params[3].return_size);
          }
          if (fromdata_ctx != (EVP_PKEY_CTX *)0x0) {
            EVP_PKEY_free((EVP_PKEY *)fromdata_ctx);
          }
          session_local._4_4_ = curvelen._4_4_;
        }
      }
      else {
        _libssh2_error(pLStack_18,-0xe,"ECDSA no exponent");
        session_local._4_4_ = -1;
      }
    }
    else {
      _libssh2_error(pLStack_18,-0xe,"ECDSA no point");
      session_local._4_4_ = -1;
    }
  }
  else {
    _libssh2_error(pLStack_18,-0xe,"ECDSA no curve");
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
gen_publickey_from_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                           libssh2_curve_type curve_type,
                                           struct string_buf *decrypted,
                                           unsigned char **method,
                                           size_t *method_len,
                                           unsigned char **pubkeydata,
                                           size_t *pubkeydata_len,
                                           libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, exponentlen, pointlen;
    unsigned char *curve, *exponent, *point_buf;
    libssh2_ecdsa_ctx *ec_key = NULL;

#ifdef USE_OPENSSL_3
    EVP_PKEY_CTX *fromdata_ctx = NULL;
    OSSL_PARAM params[4];
    const char *n = EC_curve_nid2nist(curve_type);
    char *group_name = NULL;
#else
    BIGNUM *bn_exponent;
#endif

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ECDSA keys from private key data"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &exponent, &exponentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no exponent");
        return -1;
    }

#ifdef USE_OPENSSL_3
    if(!n)
        return -1;

    fromdata_ctx = EVP_PKEY_CTX_new_id(EVP_PKEY_EC, NULL);

    if(!fromdata_ctx)
        goto fail;

    group_name = OPENSSL_zalloc(strlen(n) + 1);

    if(!group_name)
        goto fail;

    memcpy(group_name, n, strlen(n));
    _libssh2_swap_bytes(exponent, (unsigned long)exponentlen);

    params[0] = OSSL_PARAM_construct_utf8_string(OSSL_PKEY_PARAM_GROUP_NAME,
                                                 group_name, 0);

    params[1] = OSSL_PARAM_construct_octet_string(OSSL_PKEY_PARAM_PUB_KEY,
                                                  point_buf, pointlen);

    params[2] = OSSL_PARAM_construct_BN(OSSL_PKEY_PARAM_PRIV_KEY, exponent,
                                        exponentlen);

    params[3] = OSSL_PARAM_construct_end();

    if(EVP_PKEY_fromdata_init(fromdata_ctx) <= 0)
        goto fail;

    rc = EVP_PKEY_fromdata(fromdata_ctx, &ec_key, EVP_PKEY_KEYPAIR, params);
    rc = rc != 1;

    if(group_name)
        OPENSSL_clear_free(group_name, strlen(n));
#else
    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  curve_type);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    bn_exponent = BN_new();
    if(!bn_exponent) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    BN_bin2bn(exponent, (int) exponentlen, bn_exponent);
    rc = (EC_KEY_set_private_key(ec_key, bn_exponent) != 1);
#endif

    if(rc == 0 && ec_key && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = ec_key;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);
#endif

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       0, pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

#ifdef USE_OPENSSL_3
    if(fromdata_ctx)
        EVP_PKEY_CTX_free(fromdata_ctx);
#endif

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        _libssh2_ecdsa_free(ec_key);

    return rc;

fail:
#ifdef USE_OPENSSL_3
    if(fromdata_ctx)
        EVP_PKEY_CTX_free(fromdata_ctx);
#endif

    if(ec_key)
        _libssh2_ecdsa_free(ec_key);

    return rc;
}